

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OverlapGraph.cpp
# Opt level: O0

void __thiscall dgrminer::OverlapGraph::OverlapGraph(OverlapGraph *this,bool heuristic)

{
  bool heuristic_local;
  OverlapGraph *this_local;
  
  this->heuristic = heuristic;
  this->newVertex = 0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&this->vertices);
  std::
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::map(&this->adjacencyLists);
  return;
}

Assistant:

OverlapGraph::OverlapGraph(bool heuristic) : heuristic(heuristic) {}